

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

void GraphTask::run(search *sch,multi_ex *ec)

{
  ptag tag;
  task_data *D;
  example *peVar1;
  unkuint9 Var2;
  bool bVar3;
  action aVar4;
  ulong uVar5;
  pointer ppeVar6;
  size_t sVar7;
  stringstream *psVar8;
  ostream *poVar9;
  uint uVar10;
  pointer pvVar11;
  long lVar12;
  wclass *pwVar13;
  ulong n;
  uint uVar14;
  predictor *this;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  predictor P;
  float local_14c;
  predictor local_118;
  
  D = (task_data *)sch->task_data;
  sVar7 = D->num_loops;
  Var2 = (unkuint9)sVar7;
  if (D->N == 0) {
    uVar10 = 0;
  }
  else {
    uVar5 = 0;
    do {
      (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = D->K + 1;
      uVar5 = uVar5 + 1;
      uVar10 = D->N;
    } while (uVar5 < uVar10);
    sVar7 = D->num_loops;
  }
  if (sVar7 != 0) {
    uVar5 = 0;
    do {
      uVar10 = D->N - 1;
      if ((uVar5 & 1) == 0) {
        uVar10 = 0;
      }
      uVar14 = -(uint)((uVar5 & 1) != 0) | D->N;
      if (uVar10 != uVar14) {
        local_14c = 0.5;
        if (uVar5 != sVar7 - 1) {
          local_14c = 0.5 / (float)(unkint9)Var2;
        }
        lVar12 = (long)(int)uVar10;
        do {
          uVar10 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12];
          n = (ulong)uVar10;
          peVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[n];
          pwVar13 = (peVar1->l).cs.costs._begin;
          if ((peVar1->l).cs.costs._end == pwVar13) {
            aVar4 = 0;
          }
          else {
            aVar4 = pwVar13->class_index;
          }
          bVar3 = Search::search::predictNeedsExample(sch);
          if (bVar3) {
            add_edge_features(sch,D,n,ec);
          }
          Search::predictor::predictor(&local_118,sch,uVar10 + 1);
          Search::predictor::set_input
                    (&local_118,
                     (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[n]);
          if (D->separate_learners == true) {
            Search::predictor::set_learner_id(&local_118,uVar5);
          }
          if (aVar4 != 0) {
            Search::predictor::set_oracle(&local_118,aVar4);
          }
          pvVar11 = (D->adj).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar11[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data + 8) !=
              pvVar11[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ppeVar6 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              pwVar13 = (ppeVar6[uVar16]->l).cs.costs._begin;
              if ((ppeVar6[uVar16]->l).cs.costs._end != pwVar13) {
                lVar17 = 4;
                uVar15 = 0;
                do {
                  tag = *(ptag *)((long)&pwVar13->x + lVar17);
                  if ((tag != 0) && (tag - 1 != uVar10)) {
                    Search::predictor::add_condition(&local_118,tag,'e');
                    ppeVar6 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                  }
                  uVar15 = uVar15 + 1;
                  pwVar13 = (ppeVar6[uVar16]->l).cs.costs._begin;
                  lVar17 = lVar17 + 0x10;
                } while (uVar15 < (ulong)((long)(ppeVar6[uVar16]->l).cs.costs._end - (long)pwVar13
                                         >> 4));
                pvVar11 = (D->adj).
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < (ulong)((long)*(pointer *)
                                             ((long)&pvVar11[n].
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      *(long *)&pvVar11[n].
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data >> 3));
          }
          this = &local_118;
          aVar4 = Search::predictor::predict(this);
          (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[n] = (ulong)aVar4;
          peVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[n];
          pwVar13 = (peVar1->l).cs.costs._begin;
          if ((peVar1->l).cs.costs._end != pwVar13) {
            fVar18 = 0.0;
            if ((D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[n] != (ulong)pwVar13->class_index) {
              fVar18 = local_14c;
            }
            this = (predictor *)sch;
            Search::search::loss(sch,fVar18);
          }
          if (bVar3) {
            del_edge_features((task_data *)this,uVar10,ec);
          }
          Search::predictor::~predictor(&local_118);
          lVar12 = lVar12 + (-(ulong)((uint)uVar5 & 1) | 1);
        } while (uVar14 != (uint)lVar12);
        sVar7 = D->num_loops;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < sVar7);
    uVar10 = D->N;
  }
  if (uVar10 != 0) {
    uVar5 = 0;
    do {
      D->confusion_matrix
      [(D->K + 1) *
       (ulong)(((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar5]->l).cs.costs._begin)->class_index +
       (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar5]] =
           D->confusion_matrix
           [(D->K + 1) *
            (ulong)(((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5]->l).cs.costs._begin)->class_index +
            (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5]] + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < D->N);
  }
  fVar18 = macro_f(D);
  Search::search::loss(sch,1.0 - fVar18);
  psVar8 = Search::search::output_abi_cxx11_(sch);
  if ((*(int *)(psVar8 + *(long *)(*(long *)psVar8 + -0x18) + 0x20) == 0) && (D->N != 0)) {
    uVar5 = 0;
    do {
      psVar8 = Search::search::output_abi_cxx11_(sch);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar8 + 0x10));
      local_118.is_ldf = true;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_118.is_ldf,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < D->N);
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  float loss_val = 0.5f / (float)D.num_loops;
  for (size_t n = 0; n < D.N; n++) D.pred[n] = D.K + 1;

  for (size_t loop = 0; loop < D.num_loops; loop++)
  {
    bool last_loop = loop == (D.num_loops - 1);
    int start = 0;
    int end = D.N;
    int step = 1;
    if (loop % 2 == 1)
    {
      start = D.N - 1;
      end = -1;
      step = -1;
    }  // go inward on odd loops
    for (int n_id = start; n_id != end; n_id += step)
    {
      uint32_t n = D.bfs[n_id];
      uint32_t k = (ec[n]->l.cs.costs.size() > 0) ? ec[n]->l.cs.costs[0].class_index : 0;

      bool add_features = /* D.use_structure && */ sch.predictNeedsExample();
      // add_features = false;

      if (add_features)
        add_edge_features(sch, D, n, ec);
      Search::predictor P = Search::predictor(sch, n + 1);
      P.set_input(*ec[n]);
      if (false && (k > 0))
      {
        float min_count = 1e12f;
        for (size_t k2 = 1; k2 <= D.K; k2++) min_count = min(min_count, D.true_counts[k2]);
        float w = min_count / D.true_counts[k];
        // float w = D.true_counts_total / D.true_counts[k] / (float)(D.K);
        P.set_weight(w);
        // cerr << "w = " << D.true_counts_total / D.true_counts[k] / (float)(D.K) << endl;
        // P.set_weight( D.true_counts_total / D.true_counts[k] / (float)(D.K) );
      }
      if (D.separate_learners)
        P.set_learner_id(loop);
      if (k > 0)  // for test examples
        P.set_oracle(k);
      // add all the conditioning
      for (size_t i = 0; i < D.adj[n].size(); i++)
      {
        for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            continue;
          m--;
          if (m == n)
            continue;
          P.add_condition(m + 1, 'e');
        }
      }

      // make the prediction
      D.pred[n] = P.predict();
      if (ec[n]->l.cs.costs.size() > 0)  // for test examples
        sch.loss((ec[n]->l.cs.costs[0].class_index == D.pred[n]) ? 0.f : (last_loop ? 0.5f : loss_val));

      if (add_features)
        del_edge_features(D, n, ec);
    }
  }

  for (uint32_t n = 0; n < D.N; n++) D.confusion_matrix[IDX(ec[n]->l.cs.costs[0].class_index, D.pred[n])]++;
  sch.loss(1.f - macro_f(D));

  if (sch.output().good())
    for (uint32_t n = 0; n < D.N; n++) sch.output() << D.pred[n] << ' ';
}